

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDec.c
# Opt level: O3

void Abc_TruthGetParams(char *pFileName,int *pnVars,int *pnTruths)

{
  byte bVar1;
  char cVar2;
  char *__ptr;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  ulong uVar6;
  
  if (pnVars != (int *)0x0) {
    *pnVars = 0;
  }
  if (pnTruths != (int *)0x0) {
    *pnTruths = 0;
  }
  __ptr = Abc_FileRead(pFileName);
  if (__ptr == (char *)0x0) {
    return;
  }
  uVar6 = 0;
LAB_002b0898:
  bVar1 = __ptr[uVar6];
  if (bVar1 < 0xd) {
    if (bVar1 == 0) {
      puts("Strange, the input file does not have spaces and new-lines...");
LAB_002b08d4:
      cVar2 = *__ptr;
      uVar4 = uVar6;
      if ((cVar2 == '0') && (uVar4 = (ulong)((int)uVar6 - 2), __ptr[1] != 'x')) {
        uVar4 = uVar6 & 0xffffffff;
      }
      iVar3 = 0;
      do {
        if ((int)uVar4 << 2 == 1 << ((byte)iVar3 & 0x1f)) {
          if (0xfffffff0 < iVar3 - 0x11U) {
            if (pnVars != (int *)0x0) {
              *pnVars = iVar3;
            }
            if (cVar2 == '\0') {
              iVar3 = 0;
            }
            else {
              iVar3 = 0;
              pcVar5 = __ptr;
              do {
                pcVar5 = pcVar5 + 1;
                iVar3 = iVar3 + (uint)(cVar2 == '\n');
                cVar2 = *pcVar5;
              } while (cVar2 != '\0');
            }
            if (pnTruths != (int *)0x0) {
              *pnTruths = iVar3;
            }
            free(__ptr);
            return;
          }
          break;
        }
        iVar3 = iVar3 + 1;
      } while (iVar3 != 0x20);
      puts("Does not look like the input file contains truth tables...");
      return;
    }
    if (bVar1 == 10) goto LAB_002b08d4;
  }
  else if ((bVar1 == 0xd) || (bVar1 == 0x20)) goto LAB_002b08d4;
  uVar6 = uVar6 + 1;
  goto LAB_002b0898;
}

Assistant:

void Abc_TruthGetParams( char * pFileName, int * pnVars, int * pnTruths )
{
    char * pContents;
    int i, nVars, nLines;
    // prepare the output 
    if ( pnVars )
        *pnVars = 0;
    if ( pnTruths )
        *pnTruths = 0;
    // read data from file
    pContents = Abc_FileRead( pFileName );
    if ( pContents == NULL )
        return;
    // count the number of symbols before the first space or new-line
    // (note that on Windows symbols '\r' can be inserted before each '\n')
    for ( i = 0; pContents[i]; i++ )
        if ( pContents[i] == ' ' || pContents[i] == '\n' || pContents[i] == '\r' )
            break;
    if ( pContents[i] == 0 )
        printf( "Strange, the input file does not have spaces and new-lines...\n" );

    // acount for the fact that truth tables may have "0x" at the beginning of each line
    if ( pContents[0] == '0' && pContents[1] == 'x' )
        i = i - 2;

    // determine the number of variables
    for ( nVars = 0; nVars < 32; nVars++ )
        if ( 4 * i == (1 << nVars) ) // the number of bits equal to the size of truth table
            break;
    if ( nVars < 2 || nVars > 16 )
    {
        printf( "Does not look like the input file contains truth tables...\n" );
        return;
    }
    if ( pnVars )
        *pnVars = nVars;

    // determine the number of functions by counting the lines
    nLines = 0;
    for ( i = 0; pContents[i]; i++ )
        nLines += (pContents[i] == '\n');
    if ( pnTruths )
        *pnTruths = nLines;
    ABC_FREE( pContents );
}